

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void QSslSocketPrivate::resetDefaultEllipticCurves(void)

{
  bool bVar1;
  QTlsBackend *pQVar2;
  qsizetype qVar3;
  int *piVar4;
  long in_FS_OFFSET;
  int id;
  QList<int> *__range1;
  QTlsBackend *tlsBackend;
  QSslEllipticCurve curve;
  iterator __end1;
  iterator __begin1;
  QList<QSslEllipticCurve> curves;
  QList<int> ids;
  undefined4 in_stack_ffffffffffffff88;
  int iVar5;
  QList<QSslEllipticCurve> *this;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QSslEllipticCurve local_54;
  int *local_50;
  QList<QSslEllipticCurve> *in_stack_ffffffffffffffb8;
  iterator iVar6;
  iterator local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  QList<QSslEllipticCurve> local_20;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  pQVar2 = tlsBackendInUse();
  if (pQVar2 != (QTlsBackend *)0x0) {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QSslEllipticCurve *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    (**(code **)(*(long *)pQVar2 + 0x100))(&local_20);
    qVar3 = QList<int>::size((QList<int> *)&local_20);
    if (qVar3 != 0) {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      local_28 = 0xaaaaaaaaaaaaaaaa;
      QList<QSslEllipticCurve>::QList((QList<QSslEllipticCurve> *)0x3a570f);
      QList<int>::size((QList<int> *)&local_20);
      QList<QSslEllipticCurve>::reserve(in_stack_ffffffffffffffb8,asize);
      this = &local_20;
      local_40.i = (int *)0xaaaaaaaaaaaaaaaa;
      local_40 = QList<int>::begin((QList<int> *)this);
      local_50 = (int *)QList<int>::end((QList<int> *)this);
      while (iVar6.i = local_50,
            bVar1 = QList<int>::iterator::operator!=(&local_40,(iterator)local_50), bVar1) {
        piVar4 = QList<int>::iterator::operator*(&local_40);
        iVar5 = *piVar4;
        local_54.id = -0x55555556;
        QSslEllipticCurve::QSslEllipticCurve(&local_54);
        local_54.id = iVar5;
        QList<QSslEllipticCurve>::append
                  (this,(parameter_type)CONCAT44(iVar5,in_stack_ffffffffffffff88));
        QList<int>::iterator::operator++(&local_40);
        local_50 = iVar6.i;
      }
      setDefaultSupportedEllipticCurves
                ((QList<QSslEllipticCurve> *)
                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      QList<QSslEllipticCurve>::~QList((QList<QSslEllipticCurve> *)0x3a57ef);
    }
    QList<int>::~QList((QList<int> *)0x3a5801);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocketPrivate::resetDefaultEllipticCurves()
{
    const auto *tlsBackend = tlsBackendInUse();
    if (!tlsBackend)
        return;

    auto ids = tlsBackend->ellipticCurvesIds();
    if (!ids.size())
        return;

    QList<QSslEllipticCurve> curves;
    curves.reserve(ids.size());
    for (int id : ids) {
        QSslEllipticCurve curve;
        curve.id = id;
        curves.append(curve);
    }

    // Set the list of supported ECs, but not the list
    // of *default* ECs. OpenSSL doesn't like forcing an EC for the wrong
    // ciphersuite, so don't try it -- leave the empty list to mean
    // "the implementation will choose the most suitable one".
    setDefaultSupportedEllipticCurves(curves);
}